

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O2

void dradb2(int ido,int l1,float *cc,float *ch,float *wa1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  float *pfVar13;
  int iVar14;
  bool bVar15;
  
  iVar6 = l1 * ido;
  iVar5 = ido * 2;
  lVar8 = (long)ido;
  iVar10 = 0;
  if (l1 < 1) {
    l1 = 0;
  }
  pfVar13 = ch;
  iVar11 = l1;
  while (bVar15 = iVar11 != 0, iVar11 = iVar11 + -1, bVar15) {
    iVar9 = ido * 2 + -1 + iVar10;
    *pfVar13 = cc[iVar10] + cc[iVar9];
    pfVar13[iVar6] = cc[iVar10] - cc[iVar9];
    pfVar13 = pfVar13 + lVar8;
    iVar10 = iVar10 + iVar5;
  }
  if (1 < ido) {
    if (ido != 2) {
      iVar9 = 0;
      pfVar13 = ch;
      iVar10 = iVar5;
      iVar11 = iVar6;
      for (iVar14 = 0; iVar14 != l1; iVar14 = iVar14 + 1) {
        pfVar7 = cc + (long)iVar10 + -2;
        for (lVar12 = 2; lVar12 < lVar8; lVar12 = lVar12 + 2) {
          pfVar13[lVar12 + -1] = cc[(long)iVar9 + lVar12 + -1] + pfVar7[-1];
          fVar1 = cc[(long)iVar9 + lVar12 + -1];
          fVar2 = pfVar7[-1];
          pfVar13[lVar12] = cc[iVar9 + lVar12] - *pfVar7;
          fVar3 = cc[iVar9 + lVar12];
          fVar4 = *pfVar7;
          ch[(long)iVar11 + lVar12 + -1] =
               wa1[lVar12 + -2] * (fVar1 - fVar2) - wa1[lVar12 + -1] * (fVar3 + fVar4);
          ch[iVar11 + lVar12] =
               (fVar3 + fVar4) * wa1[lVar12 + -2] + (fVar1 - fVar2) * wa1[lVar12 + -1];
          pfVar7 = pfVar7 + -2;
        }
        iVar9 = iVar9 + iVar5;
        iVar10 = iVar10 + iVar5;
        iVar11 = iVar11 + ido;
        pfVar13 = pfVar13 + (uint)ido;
      }
      if ((ido & 1U) != 0) {
        return;
      }
    }
    pfVar7 = cc + (long)(ido + -1) + 1;
    pfVar13 = ch + (ido + -1);
    while (bVar15 = l1 != 0, l1 = l1 + -1, bVar15) {
      *pfVar13 = pfVar7[-1] + pfVar7[-1];
      pfVar13[iVar6] = -(*pfVar7 + *pfVar7);
      pfVar7 = pfVar7 + iVar5;
      pfVar13 = pfVar13 + lVar8;
    }
  }
  return;
}

Assistant:

static void dradb2(int ido,int l1,float *cc,float *ch,float *wa1){
  int i,k,t0,t1,t2,t3,t4,t5,t6;
  float ti2,tr2;

  t0=l1*ido;

  t1=0;
  t2=0;
  t3=(ido<<1)-1;
  for(k=0;k<l1;k++){
    ch[t1]=cc[t2]+cc[t3+t2];
    ch[t1+t0]=cc[t2]-cc[t3+t2];
    t2=(t1+=ido)<<1;
  }

  if(ido<2)return;
  if(ido==2)goto L105;

  t1=0;
  t2=0;
  for(k=0;k<l1;k++){
    t3=t1;
    t5=(t4=t2)+(ido<<1);
    t6=t0+t1;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t5-=2;
      t6+=2;
      ch[t3-1]=cc[t4-1]+cc[t5-1];
      tr2=cc[t4-1]-cc[t5-1];
      ch[t3]=cc[t4]-cc[t5];
      ti2=cc[t4]+cc[t5];
      ch[t6-1]=wa1[i-2]*tr2-wa1[i-1]*ti2;
      ch[t6]=wa1[i-2]*ti2+wa1[i-1]*tr2;
    }
    t2=(t1+=ido)<<1;
  }

  if(ido%2==1)return;

L105:
  t1=ido-1;
  t2=ido-1;
  for(k=0;k<l1;k++){
    ch[t1]=cc[t2]+cc[t2];
    ch[t1+t0]=-(cc[t2+1]+cc[t2+1]);
    t1+=ido;
    t2+=ido<<1;
  }
}